

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
          (QMovableArrayOps<QDBusMenuLayoutItem> *this,qsizetype i,QDBusMenuLayoutItem *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  Data *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QDBusMenuLayoutItem tmp;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar6;
  Inserter *this_00;
  Inserter local_58;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QDBusMenuLayoutItem>::needsDetach
                    ((QArrayDataPointer<QDBusMenuLayoutItem> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d) &&
       (qVar3 = QArrayDataPointer<QDBusMenuLayoutItem>::freeSpaceAtEnd
                          ((QArrayDataPointer<QDBusMenuLayoutItem> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<QDBusMenuLayoutItem>::end((QArrayDataPointer<QDBusMenuLayoutItem> *)in_RDI);
      QDBusMenuLayoutItem::QDBusMenuLayoutItem
                ((QDBusMenuLayoutItem *)in_RDI,
                 (QDBusMenuLayoutItem *)
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      (((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d =
           (Data *)((long)&(((((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d)->
                           super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1);
      goto LAB_00b09858;
    }
    if ((in_RSI == (Data *)0x0) &&
       (qVar3 = QArrayDataPointer<QDBusMenuLayoutItem>::freeSpaceAtBegin
                          ((QArrayDataPointer<QDBusMenuLayoutItem> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<QDBusMenuLayoutItem>::begin
                ((QArrayDataPointer<QDBusMenuLayoutItem> *)0xb0972a);
      QDBusMenuLayoutItem::QDBusMenuLayoutItem
                ((QDBusMenuLayoutItem *)in_RDI,
                 (QDBusMenuLayoutItem *)
                 CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      (((QVariantMap *)&in_RDI->displaceFrom)->d).d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)&(((QVariantMap *)&in_RDI->displaceFrom)->d).d.ptr[-1].m._M_t._M_impl.
               super__Rb_tree_header;
      (((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d =
           (Data *)((long)&(((((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d)->
                           super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1);
      goto LAB_00b09858;
    }
  }
  memset(local_30,0xaa,0x28);
  QDBusMenuLayoutItem::QDBusMenuLayoutItem
            ((QDBusMenuLayoutItem *)in_RDI,
             (QDBusMenuLayoutItem *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar4 = (((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d != (Data *)0x0;
  uVar5 = bVar4 && in_RSI == (Data *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (Data *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QDBusMenuLayoutItem>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuLayoutItem> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QDBusMenuLayoutItem **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff8c,uVar2))),
             (QArrayDataPointer<QDBusMenuLayoutItem> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QDBusMenuLayoutItem> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff8c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::insertOne(in_RDI,(QDBusMenuLayoutItem *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::~Inserter(&local_58);
  }
  else {
    QArrayDataPointer<QDBusMenuLayoutItem>::begin
              ((QArrayDataPointer<QDBusMenuLayoutItem> *)0xb097ec);
    QDBusMenuLayoutItem::QDBusMenuLayoutItem
              ((QDBusMenuLayoutItem *)in_RDI,
               (QDBusMenuLayoutItem *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    (((QVariantMap *)&in_RDI->displaceFrom)->d).d.ptr =
         (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)&(((QVariantMap *)&in_RDI->displaceFrom)->d).d.ptr[-1].m._M_t._M_impl.
             super__Rb_tree_header;
    (((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d =
         (Data *)((long)&(((((QList<QDBusMenuLayoutItem> *)&in_RDI->displaceTo)->d).d)->
                         super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1);
  }
  QDBusMenuLayoutItem::~QDBusMenuLayoutItem((QDBusMenuLayoutItem *)in_RDI);
LAB_00b09858:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }